

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# platformplugin_posix.cpp
# Opt level: O1

shared_ptr<IPlatformPlugin> CreatePlatformPlugin_Posix(shared_ptr<Options> *options)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  shared_ptr<IPlatformPlugin> sVar2;
  
  p_Var1 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x18);
  p_Var1->_M_use_count = 1;
  p_Var1->_M_weak_count = 1;
  p_Var1->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00126c58;
  p_Var1[1]._vptr__Sp_counted_base = (_func_int **)&PTR__IPlatformPlugin_00126ca8;
  (options->super___shared_ptr<Options,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
       (element_type *)(p_Var1 + 1);
  (options->super___shared_ptr<Options,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi = p_Var1;
  sVar2.super___shared_ptr<IPlatformPlugin,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&PTR__IPlatformPlugin_00126ca8;
  sVar2.super___shared_ptr<IPlatformPlugin,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)options;
  return (shared_ptr<IPlatformPlugin>)
         sVar2.super___shared_ptr<IPlatformPlugin,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<IPlatformPlugin> CreatePlatformPlugin_Posix(const std::shared_ptr<Options>& options) {
    return std::make_shared<PosixPlatformPlugin>(options);
}